

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall irr::video::CNullDriver::addHighLevelShaderMaterialFromFiles(CNullDriver *this)

{
  path *unaff_RBX;
  undefined8 unaff_R12;
  c8 *unaff_R13;
  path *unaff_R14;
  CNullDriver *unaff_R15;
  E_PIXEL_SHADER_TYPE in_stack_00000030;
  undefined4 in_stack_00000038;
  undefined4 in_stack_0000003c;
  c8 *in_stack_00000040;
  E_GEOMETRY_SHADER_TYPE in_stack_00000048;
  E_PRIMITIVE_TYPE in_stack_00000050;
  E_PRIMITIVE_TYPE in_stack_00000058;
  u32 in_stack_00000060;
  IShaderConstantSetCallBack *in_stack_00000068;
  E_MATERIAL_TYPE in_stack_00000070;
  s32 in_stack_00000078;
  
  addHighLevelShaderMaterialFromFiles
            (unaff_R15,unaff_R14,unaff_R13,(E_VERTEX_SHADER_TYPE)((ulong)unaff_R12 >> 0x20),
             unaff_RBX,(c8 *)this,in_stack_00000030,
             (path *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000040,
             in_stack_00000048,in_stack_00000050,in_stack_00000058,in_stack_00000060,
             in_stack_00000068,in_stack_00000070,in_stack_00000078);
  return;
}

Assistant:

s32 CNullDriver::addHighLevelShaderMaterialFromFiles(
		const io::path &vertexShaderProgramFileName,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const io::path &pixelShaderProgramFileName,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const io::path &geometryShaderProgramFileName,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	io::IReadFile *vsfile = 0;
	io::IReadFile *psfile = 0;
	io::IReadFile *gsfile = 0;

	if (vertexShaderProgramFileName.size()) {
		vsfile = FileSystem->createAndOpenFile(vertexShaderProgramFileName);
		if (!vsfile) {
			os::Printer::log("Could not open vertex shader program file",
					vertexShaderProgramFileName, ELL_WARNING);
		}
	}

	if (pixelShaderProgramFileName.size()) {
		psfile = FileSystem->createAndOpenFile(pixelShaderProgramFileName);
		if (!psfile) {
			os::Printer::log("Could not open pixel shader program file",
					pixelShaderProgramFileName, ELL_WARNING);
		}
	}

	if (geometryShaderProgramFileName.size()) {
		gsfile = FileSystem->createAndOpenFile(geometryShaderProgramFileName);
		if (!gsfile) {
			os::Printer::log("Could not open geometry shader program file",
					geometryShaderProgramFileName, ELL_WARNING);
		}
	}

	s32 result = addHighLevelShaderMaterialFromFiles(
			vsfile, vertexShaderEntryPointName, vsCompileTarget,
			psfile, pixelShaderEntryPointName, psCompileTarget,
			gsfile, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	if (psfile)
		psfile->drop();

	if (vsfile)
		vsfile->drop();

	if (gsfile)
		gsfile->drop();

	return result;
}